

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O2

int XLearnCV(XL *out)

{
  Solver *this;
  HyperParam *hyper_param;
  float fVar1;
  Timer timer;
  string local_30;
  
  Timer::Timer(&timer);
  Timer::tic(&timer);
  hyper_param = (HyperParam *)*out;
  this = (Solver *)(hyper_param + 1);
  hyper_param->cross_validation = true;
  hyper_param->is_train = true;
  xLearn::Solver::Initialize(this,hyper_param);
  xLearn::Solver::StartWork(this);
  xLearn::Solver::Clear(this);
  hyper_param->cross_validation = false;
  fVar1 = Timer::toc(&timer);
  StringPrintf_abi_cxx11_(&local_30,"Total time cost: %.2f (sec)",(double)fVar1);
  Color::print_info(&local_30,true);
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

XL_DLL int XLearnCV(XL *out) {
  API_BEGIN();
  Timer timer;
  timer.tic();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  xl->GetHyperParam().cross_validation = true;
  xl->GetHyperParam().is_train = true;
  xl->GetSolver().Initialize(xl->GetHyperParam());
  xl->GetSolver().StartWork();
  xl->GetSolver().Clear();
  xl->GetHyperParam().cross_validation = false;
  Color::print_info(
    StringPrintf("Total time cost: %.2f (sec)", 
    timer.toc()), true);
  API_END();
}